

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O0

bool __thiscall
node::BlockManager::LoadBlockIndexDB(BlockManager *this,optional<uint256> *snapshot_blockhash)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer fValue;
  long in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  uint last_height_in_file;
  size_t i;
  type *block_index;
  type *_;
  BlockMap *__range1;
  int nFile_1;
  int nFile;
  bool fReindexing;
  FlatFilePos pos;
  iterator it;
  iterator __end1;
  iterator __begin1;
  CBlockFileInfo info;
  int max_blockfile_num;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock9;
  set<int,_std::less<int>,_std::allocator<int>_> setBlkDataFiles;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffd2c;
  int *in_stack_fffffffffffffd30;
  char *pcVar5;
  BlockTreeDB *in_stack_fffffffffffffd38;
  char *pcVar6;
  char *in_stack_fffffffffffffd40;
  int *__str;
  BlockManager *this_00;
  undefined4 in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  char *in_stack_fffffffffffffd58;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffd60;
  string *name;
  allocator<char> *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  BlockfileType in_stack_fffffffffffffd74;
  BlockManager *in_stack_fffffffffffffd78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  CBlockFileInfo *in_stack_fffffffffffffd80;
  _Rb_tree_const_iterator<int> in_stack_fffffffffffffd90;
  undefined8 in_stack_fffffffffffffd98;
  int iVar8;
  BlockManager *pBVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_230;
  _Self in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  type *in_stack_fffffffffffffde8;
  type *in_stack_fffffffffffffdf0;
  reference in_stack_fffffffffffffdf8;
  int local_1d4;
  bool local_1b2;
  allocator<char> local_189;
  undefined4 local_188;
  undefined4 local_184;
  optional<uint256> *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  Level in_stack_fffffffffffffed0;
  char (*in_stack_fffffffffffffee0) [17];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  int local_cc [17];
  _Base_ptr local_88;
  undefined1 local_80;
  undefined8 local_8;
  
  iVar8 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = LoadBlockIndex((BlockManager *)in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  if (bVar1) {
    local_cc[0] = 0;
    std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::operator->
              ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
    kernel::BlockTreeDB::ReadLastBlockFile(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::resize
              ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               (size_type)in_stack_fffffffffffffd40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               in_stack_fffffffffffffd40);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               in_stack_fffffffffffffd40);
    __str = local_cc;
    uVar4 = 2;
    pcVar5 = "%s: last block file = %i\n";
    pcVar6 = "LoadBlockIndexDB";
    logging_function._M_str = (char *)in_stack_fffffffffffffdf8;
    logging_function._M_len = (size_t)in_stack_fffffffffffffdf0;
    source_file._M_len._4_4_ = in_stack_fffffffffffffde4;
    source_file._M_len._0_4_ = in_stack_fffffffffffffde0;
    source_file._M_str = (char *)in_stack_fffffffffffffde8;
    LogPrintFormatInternal<char[17],int>
              (logging_function,source_file,iVar8,(LogFlags)in_stack_fffffffffffffd90._M_node,
               in_stack_fffffffffffffed0,
               (ConstevalFormatString<2U>)in_stack_fffffffffffffdd8._M_node,
               in_stack_fffffffffffffee0,(int *)in_stack_fffffffffffffee8);
    for (local_1d4 = 0; local_1d4 <= local_cc[0]; local_1d4 = local_1d4 + 1) {
      std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::operator->
                ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
                 CONCAT44(in_stack_fffffffffffffd2c,uVar4));
      std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)pcVar6,(size_type)pcVar5
                );
      kernel::BlockTreeDB::ReadBlockFileInfo
                ((BlockTreeDB *)pcVar6,in_stack_fffffffffffffd4c,(CBlockFileInfo *)pcVar5);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),(char *)__str);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),(char *)__str);
    std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
              ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)pcVar6,(size_type)pcVar5);
    this_00 = (BlockManager *)&stack0xffffffffffffffd8;
    CBlockFileInfo::ToString_abi_cxx11_(in_stack_fffffffffffffd80);
    pcVar6 = "LoadBlockIndexDB";
    pcVar5 = "%s: last block file info: %s\n";
    uVar4 = 2;
    logging_function_00._M_str = (char *)in_stack_fffffffffffffdf8;
    logging_function_00._M_len = (size_t)in_stack_fffffffffffffdf0;
    source_file_00._M_len._4_4_ = in_stack_fffffffffffffde4;
    source_file_00._M_len._0_4_ = in_stack_fffffffffffffde0;
    source_file_00._M_str = (char *)in_stack_fffffffffffffde8;
    pBVar7 = this_00;
    LogPrintFormatInternal<char[17],std::__cxx11::string>
              (logging_function_00,source_file_00,(int)((ulong)this_00 >> 0x20),
               (LogFlags)in_stack_fffffffffffffd90._M_node,in_stack_fffffffffffffed0,
               (ConstevalFormatString<2U>)in_stack_fffffffffffffdd8._M_node,
               in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    while( true ) {
      CBlockFileInfo::CBlockFileInfo((CBlockFileInfo *)CONCAT44(in_stack_fffffffffffffd2c,uVar4));
      std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::operator->
                ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
                 CONCAT44(in_stack_fffffffffffffd2c,uVar4));
      bVar1 = kernel::BlockTreeDB::ReadBlockFileInfo
                        ((BlockTreeDB *)pcVar6,in_stack_fffffffffffffd4c,(CBlockFileInfo *)pcVar5);
      if (!bVar1) break;
      std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::push_back
                ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)pcVar6,
                 (value_type *)pcVar5);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),(char *)this_00);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),(char *)this_00);
    uVar4 = 2;
    pcVar5 = "Checking all blk files are present...\n";
    logging_function_01._M_str = (char *)in_stack_fffffffffffffdf8;
    logging_function_01._M_len = (size_t)in_stack_fffffffffffffdf0;
    source_file_01._M_len._4_4_ = in_stack_fffffffffffffde4;
    source_file_01._M_len._0_4_ = in_stack_fffffffffffffde0;
    source_file_01._M_str = (char *)in_stack_fffffffffffffde8;
    LogPrintFormatInternal<>
              (logging_function_01,source_file_01,(int)((ulong)pBVar7 >> 0x20),
               (LogFlags)in_stack_fffffffffffffd90._M_node,in_stack_fffffffffffffed0,
               (ConstevalFormatString<0U>)in_stack_fffffffffffffdd8._M_node);
    std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    std::
    unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
    ::begin((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
             *)pcVar5);
    std::
    unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
    ::end((unordered_map<uint256,_CBlockIndex,_BlockHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>_>
           *)pcVar5);
    while (bVar1 = std::__detail::operator==
                             ((_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true> *)
                              pcVar6,(_Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                                      *)pcVar5), ((bVar1 ^ 0xffU) & 1) != 0) {
      in_stack_fffffffffffffdf8 =
           std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::
           operator*((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                     CONCAT44(in_stack_fffffffffffffd2c,uVar4));
      in_stack_fffffffffffffdf0 =
           std::get<0ul,uint256_const,CBlockIndex>
                     ((pair<const_uint256,_CBlockIndex> *)CONCAT44(in_stack_fffffffffffffd2c,uVar4))
      ;
      in_stack_fffffffffffffde8 =
           std::get<1ul,uint256_const,CBlockIndex>
                     ((pair<const_uint256,_CBlockIndex> *)CONCAT44(in_stack_fffffffffffffd2c,uVar4))
      ;
      if ((in_stack_fffffffffffffde8->nStatus & 8) != 0) {
        pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)pcVar6,
                           (value_type_conflict2 *)pcVar5);
        in_stack_fffffffffffffd90 = pVar3.first._M_node;
        local_80 = pVar3.second;
        local_88 = in_stack_fffffffffffffd90._M_node;
      }
      std::__detail::_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true>::operator++
                ((_Node_iterator<std::pair<const_uint256,_CBlockIndex>,_false,_true> *)
                 CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    }
    std::set<int,_std::less<int>,_std::allocator<int>_>::begin
              ((set<int,_std::less<int>,_std::allocator<int>_> *)pcVar5);
    while( true ) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::end
                ((set<int,_std::less<int>,_std::allocator<int>_> *)pcVar5);
      bVar1 = std::operator==((_Self *)pcVar6,(_Self *)pcVar5);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      std::_Rb_tree_const_iterator<int>::operator*
                ((_Rb_tree_const_iterator<int> *)CONCAT44(in_stack_fffffffffffffd2c,uVar4));
      FlatFilePos::FlatFilePos((FlatFilePos *)CONCAT44(in_stack_fffffffffffffd2c,uVar4),0,0x10f9cf3)
      ;
      OpenBlockFile(in_stack_fffffffffffffd78,
                    (FlatFilePos *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                    SUB81((ulong)in_stack_fffffffffffffd68 >> 0x38,0));
      bVar1 = AutoFile::IsNull((AutoFile *)CONCAT44(in_stack_fffffffffffffd2c,uVar4));
      AutoFile::~AutoFile((AutoFile *)CONCAT44(in_stack_fffffffffffffd2c,uVar4));
      if (bVar1) {
        local_1b2 = false;
        goto LAB_010fa0ba;
      }
      in_stack_fffffffffffffdd8 =
           std::_Rb_tree_const_iterator<int>::operator++
                     ((_Rb_tree_const_iterator<int> *)this_00,(int)((ulong)pcVar6 >> 0x20));
    }
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd68,
               in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd4c,SUB41((uint)in_stack_fffffffffffffd48 >> 0x18,0));
    local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    while( true ) {
      this_01 = local_230;
      pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::size
                         ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)
                          CONCAT44(in_stack_fffffffffffffd2c,uVar4));
      iVar8 = (int)((ulong)pBVar7 >> 0x20);
      if (pbVar2 <= this_01) break;
      std::vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>::operator[]
                ((vector<CBlockFileInfo,_std::allocator<CBlockFileInfo>_> *)pcVar6,(size_type)pcVar5
                );
      local_188 = local_230._0_4_;
      local_184 = 0;
      in_stack_fffffffffffffd68 = (allocator<char> *)(in_RDI + 0x40);
      in_stack_fffffffffffffd74 = BlockfileTypeForHeight(this_00,(int)((ulong)pcVar6 >> 0x20));
      std::array<std::optional<node::BlockfileCursor>,_2UL>::operator[]
                ((array<std::optional<node::BlockfileCursor>,_2UL> *)pcVar6,(size_type)pcVar5);
      std::optional<node::BlockfileCursor>::operator=
                ((optional<node::BlockfileCursor> *)pcVar6,(BlockfileCursor *)pcVar5);
      local_230 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((long)&(local_230->_M_dataplus)._M_p + 1);
    }
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    fValue = std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::
             operator->((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>
                         *)CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    name = (string *)&local_189;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
               in_stack_fffffffffffffd68);
    kernel::BlockTreeDB::ReadFlag((BlockTreeDB *)in_stack_fffffffffffffd68,name,(bool *)fValue);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    std::allocator<char>::~allocator(&local_189);
    if ((*(byte *)(in_RDI + 600) & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),(char *)this_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),(char *)this_00);
      uVar4 = 2;
      logging_function_02._M_str = (char *)in_stack_fffffffffffffdf8;
      logging_function_02._M_len = (size_t)in_stack_fffffffffffffdf0;
      source_file_02._M_len._4_4_ = in_stack_fffffffffffffde4;
      source_file_02._M_len._0_4_ = in_stack_fffffffffffffde0;
      source_file_02._M_str = (char *)in_stack_fffffffffffffde8;
      LogPrintFormatInternal<>
                (logging_function_02,source_file_02,iVar8,
                 (LogFlags)in_stack_fffffffffffffd90._M_node,in_stack_fffffffffffffed0,
                 (ConstevalFormatString<0U>)in_stack_fffffffffffffdd8._M_node);
    }
    std::unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>::operator->
              ((unique_ptr<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,uVar4));
    kernel::BlockTreeDB::ReadReindexing
              ((BlockTreeDB *)CONCAT44(in_stack_fffffffffffffd2c,uVar4),(bool *)0x10fa085);
    local_1b2 = true;
LAB_010fa0ba:
    std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffffd2c,uVar4));
  }
  else {
    local_1b2 = false;
  }
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) == (__pthread_internal_list *)local_8) {
    return local_1b2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::LoadBlockIndexDB(const std::optional<uint256>& snapshot_blockhash)
{
    if (!LoadBlockIndex(snapshot_blockhash)) {
        return false;
    }
    int max_blockfile_num{0};

    // Load block file info
    m_block_tree_db->ReadLastBlockFile(max_blockfile_num);
    m_blockfile_info.resize(max_blockfile_num + 1);
    LogPrintf("%s: last block file = %i\n", __func__, max_blockfile_num);
    for (int nFile = 0; nFile <= max_blockfile_num; nFile++) {
        m_block_tree_db->ReadBlockFileInfo(nFile, m_blockfile_info[nFile]);
    }
    LogPrintf("%s: last block file info: %s\n", __func__, m_blockfile_info[max_blockfile_num].ToString());
    for (int nFile = max_blockfile_num + 1; true; nFile++) {
        CBlockFileInfo info;
        if (m_block_tree_db->ReadBlockFileInfo(nFile, info)) {
            m_blockfile_info.push_back(info);
        } else {
            break;
        }
    }

    // Check presence of blk files
    LogPrintf("Checking all blk files are present...\n");
    std::set<int> setBlkDataFiles;
    for (const auto& [_, block_index] : m_block_index) {
        if (block_index.nStatus & BLOCK_HAVE_DATA) {
            setBlkDataFiles.insert(block_index.nFile);
        }
    }
    for (std::set<int>::iterator it = setBlkDataFiles.begin(); it != setBlkDataFiles.end(); it++) {
        FlatFilePos pos(*it, 0);
        if (OpenBlockFile(pos, true).IsNull()) {
            return false;
        }
    }

    {
        // Initialize the blockfile cursors.
        LOCK(cs_LastBlockFile);
        for (size_t i = 0; i < m_blockfile_info.size(); ++i) {
            const auto last_height_in_file = m_blockfile_info[i].nHeightLast;
            m_blockfile_cursors[BlockfileTypeForHeight(last_height_in_file)] = {static_cast<int>(i), 0};
        }
    }

    // Check whether we have ever pruned block & undo files
    m_block_tree_db->ReadFlag("prunedblockfiles", m_have_pruned);
    if (m_have_pruned) {
        LogPrintf("LoadBlockIndexDB(): Block files have previously been pruned\n");
    }

    // Check whether we need to continue reindexing
    bool fReindexing = false;
    m_block_tree_db->ReadReindexing(fReindexing);
    if (fReindexing) m_blockfiles_indexed = false;

    return true;
}